

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::forStruct
          (Compilation *comp,ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  bool bVar3;
  int iVar4;
  Expression *pEVar5;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar6;
  ulong uVar7;
  Diagnostic *pDVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  Expression *this;
  undefined4 extraout_var;
  ReplicatedAssignmentPatternExpression *expr;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar10;
  Symbol *extraout_RDX;
  Symbol *extraout_RDX_00;
  specific_symbol_iterator<slang::ast::FieldSymbol> src;
  ulong uVar11;
  byte bVar12;
  FieldSymbol *field;
  long lVar13;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar14;
  size_t count;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  SmallVector<const_slang::ast::Type_*,_5UL> types;
  size_t local_c8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_c0;
  undefined1 local_b0 [64];
  undefined1 *local_70;
  Type *local_68;
  undefined8 local_60;
  undefined1 local_58 [40];
  
  local_c8 = 0;
  pEVar5 = bindReplCount(comp,(syntax->countExpr).ptr,context,&local_c8);
  bVar3 = Expression::bad(pEVar5);
  if (bVar3) {
    pEVar5 = Expression::badExpr(comp,(Expression *)0x0);
    return pEVar5;
  }
  local_70 = local_58;
  local_68 = (Type *)0x0;
  local_60 = 5;
  sVar14 = Scope::membersOfType<slang::ast::FieldSymbol>(structScope);
  sVar10 = sVar14._M_end.current;
  sVar6 = sVar14._M_begin.current;
  src.current = sVar10.current;
  if (sVar6.current != sVar10.current) {
    do {
      local_b0._0_8_ = DeclaredType::getType((DeclaredType *)(sVar6.current + 1));
      SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                ((SmallVectorBase<slang::ast::Type_const*> *)&local_70,(Type **)local_b0);
      do {
        sVar6.current = (sVar6.current)->nextInScope;
        if (sVar6.current == (Symbol *)0x0) break;
      } while ((sVar6.current)->kind != Field);
      src.current = extraout_RDX;
    } while (sVar6.current != sVar10.current);
  }
  sVar2 = local_c8;
  uVar7 = (syntax->items).elements._M_extent._M_extent_value + 1;
  uVar11 = uVar7 >> 1;
  if (local_68 == (Type *)(uVar11 * local_c8)) {
    local_b0._0_8_ = local_b0 + 0x18;
    local_b0._8_8_ = 0;
    local_b0._16_8_ = 5;
    if (uVar7 < 2) {
      bVar12 = 0;
    }
    else {
      lVar13 = 0;
      uVar7 = 0;
      bVar12 = 0;
      do {
        ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((syntax->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar13));
        auVar1._8_8_ = 0;
        auVar1._0_8_ = context;
        this = Expression::bindRValue
                         (*(Expression **)(local_70 + uVar7 * 8),(Type *)*ppSVar9,
                          (ExpressionSyntax *)0x0,(SourceRange)(auVar1 << 0x40),(ASTContext *)0x0,
                          (bitmask<slang::ast::ASTFlags>)syntax);
        local_c0._M_ptr = (pointer)this;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,
                   (Expression **)&local_c0);
        bVar3 = Expression::bad(this);
        uVar7 = uVar7 + 1;
        bVar12 = bVar12 | bVar3;
        lVar13 = lVar13 + 0x30;
        src.current = extraout_RDX_00;
      } while (uVar11 != uVar7);
    }
    iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,
                       (EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)src.current);
    local_c0._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
    expr = BumpAllocator::
           emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                     (&comp->super_BumpAllocator,type,pEVar5,&local_c0,&sourceRange);
    if (bVar12 != 0) {
      expr = (ReplicatedAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)expr);
    }
    if ((Type *)local_b0._0_8_ != (Type *)(local_b0 + 0x18)) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  else {
    pDVar8 = ASTContext::addDiag(context,(DiagCode)0xae0007,sourceRange);
    pDVar8 = ast::operator<<(pDVar8,type);
    local_b0._0_8_ = local_68;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar8->args,(unsigned_long *)local_b0);
    local_b0._0_8_ = ((syntax->items).elements._M_extent._M_extent_value + 1 >> 1) * sVar2;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar8->args,(unsigned_long *)local_b0);
    expr = (ReplicatedAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)0x0);
  }
  if (local_70 != local_58) {
    operator_delete(local_70);
  }
  return (Expression *)expr;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forStruct(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    SmallVector<const Type*> types;
    for (auto& field : structScope.membersOfType<FieldSymbol>())
        types.push_back(&field.getType());

    if (types.size() != syntax.items.size() * count) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << type << types.size() << syntax.items.size() * count;
        return badExpr(comp, nullptr);
    }

    bool bad = false;
    size_t index = 0;
    SmallVector<const Expression*> elems;
    for (auto item : syntax.items) {
        auto& expr = Expression::bindRValue(*types[index++], *item, {}, context);
        elems.push_back(&expr);
        bad |= expr.bad();
    }

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr,
                                                                      elems.copy(comp),
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}